

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Zp_field_operators.h
# Opt level: O0

void __thiscall
Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::Zp_field_operators
          (Zp_field_operators<unsigned_int,_void> *this,Characteristic characteristic)

{
  Characteristic characteristic_local;
  Zp_field_operators<unsigned_int,_void> *this_local;
  
  this->characteristic_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->inverse_);
  if (characteristic != 0) {
    set_characteristic(this,characteristic);
  }
  return;
}

Assistant:

Zp_field_operators(Characteristic characteristic = 0) : characteristic_(0) {
    if (characteristic != 0) set_characteristic(characteristic);
  }